

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

void main_loop(void)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  string_view trigger;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  basic_string_view<char,_std::char_traits<char>_> *in_whitespace;
  ulong uVar4;
  reference ppPVar5;
  ostream *poVar6;
  basic_ostream<char,_std::char_traits<char>_> *pbVar7;
  int local_94;
  duration<long,_std::ratio<1L,_1000L>_> local_90;
  ConsoleCommand *local_88;
  size_t local_80;
  char *local_78;
  size_t local_70;
  ConsoleCommand *local_68;
  size_t local_60;
  ConsoleCommand *local_58;
  ConsoleCommand *command;
  string_view command_name;
  undefined1 local_30 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  input_split;
  size_t index;
  
LAB_0013c9ab:
  input_split.second._M_str = (char *)0x0;
LAB_0013c9b3:
  do {
    pcVar1 = input_split.second._M_str;
    in_whitespace =
         (basic_string_view<char,_std::char_traits<char>_> *)
         std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>::size(Jupiter::plugins);
    if (in_whitespace <= pcVar1) break;
    std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>::operator[]
              (Jupiter::plugins,(size_type)input_split.second._M_str);
    uVar4 = Jupiter::Plugin::shouldRemove();
    if ((uVar4 & 1) == 0) {
      ppPVar5 = std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>::operator[]
                          (Jupiter::plugins,(size_type)input_split.second._M_str);
      iVar3 = (*(code *)**(undefined8 **)*ppPVar5)();
      if (iVar3 == 0) {
        input_split.second._M_str = input_split.second._M_str + 1;
        goto LAB_0013c9b3;
      }
    }
    Jupiter::Plugin::free((ulong)input_split.second._M_str);
  } while( true );
  Jupiter::Timer::check();
  bVar2 = std::mutex::try_lock(&console_input.input_mutex);
  if (bVar2) {
    if ((console_input.awaiting_processing & 1U) != 0) {
      console_input.awaiting_processing = false;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&command_name._M_str," \t");
      jessilib::
      word_split_once_view<,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  *)local_30,(jessilib *)&console_input,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &command_name._M_str,in_whitespace);
      command = (ConsoleCommand *)local_30;
      command_name._M_len = input_split.first._M_len;
      local_68 = (ConsoleCommand *)local_30;
      local_60 = input_split.first._M_len;
      trigger._M_str = (char *)input_split.first._M_len;
      trigger._M_len = (size_t)local_30;
      local_58 = getConsoleCommand(trigger);
      if (local_58 == (ConsoleCommand *)0x0) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Error: Command \"");
        local_88 = command;
        local_80 = command_name._M_len;
        __str._M_str = (char *)command_name._M_len;
        __str._M_len = (size_t)command;
        pbVar7 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar6,__str);
        poVar6 = std::operator<<((ostream *)pbVar7,"\" not found.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      else {
        local_78 = input_split.first._M_str;
        local_70 = input_split.second._M_len;
        (*(local_58->super_Command)._vptr_Command[3])
                  (local_58,input_split.first._M_str,input_split.second._M_len);
      }
    }
    std::mutex::unlock(&console_input.input_mutex);
  }
  local_94 = 1;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_90,&local_94);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_90);
  goto LAB_0013c9ab;
}

Assistant:

[[noreturn]] void main_loop() {
	size_t index;
	while (1) {
		index = 0;
		while (index < Jupiter::plugins.size()) {
			if (Jupiter::plugins[index]->shouldRemove() || Jupiter::plugins[index]->think() != 0) {
				Jupiter::Plugin::free(index);
			}
			else {
				++index;
			}
		}
		Jupiter::Timer::check();

		if (console_input.input_mutex.try_lock()) {
			if (console_input.awaiting_processing) {
				console_input.awaiting_processing = false;
				auto input_split = jessilib::word_split_once_view(console_input.input, WHITESPACE_SV);
				std::string_view command_name = input_split.first;

				ConsoleCommand* command = getConsoleCommand(command_name);
				if (command != nullptr) {
					command->trigger(input_split.second);
				}
				else {
					std::cout << "Error: Command \"" << command_name << "\" not found." << std::endl;
				}
			}
			console_input.input_mutex.unlock();
		}
		std::this_thread::sleep_for((std::chrono::milliseconds(1)));
	}
}